

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapeParser.hpp
# Opt level: O1

SymbolType __thiscall
Storage::Tape::Parser<Storage::Tape::Commodore::SymbolType>::get_next_symbol
          (Parser<Storage::Tape::Commodore::SymbolType> *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  int iVar1;
  Pulse local_28;
  
  if (this->has_next_symbol_ == false) {
    do {
      iVar1 = (**((tape->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 )->_vptr_Tape)();
      if ((char)iVar1 != '\0') break;
      local_28 = Tape::get_next_pulse
                           ((tape->
                            super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr);
      (**this->_vptr_Parser)(this,&local_28);
    } while (this->has_next_symbol_ != true);
  }
  if ((this->has_next_symbol_ == false) &&
     (iVar1 = (**((tape->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 )->_vptr_Tape)(), (char)iVar1 != '\0')) {
    (*this->_vptr_Parser[1])(this);
  }
  this->has_next_symbol_ = false;
  return this->next_symbol_;
}

Assistant:

SymbolType get_next_symbol(const std::shared_ptr<Storage::Tape::Tape> &tape) {
			while(!has_next_symbol_ && !tape->is_at_end()) {
				process_pulse(tape->get_next_pulse());
			}
			if(!has_next_symbol_ && tape->is_at_end()) mark_end();
			has_next_symbol_ = false;
			return next_symbol_;
		}